

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O2

void duckdb::ReadFileExecute<duckdb::ReadTextOperation>
               (ClientContext *context,TableFunctionInput *input,DataChunk *output)

{
  bool bVar1;
  FunctionData *pFVar2;
  GlobalTableFunctionState *pGVar3;
  ulong uVar4;
  const_reference path;
  reference pvVar5;
  idx_t val;
  reference pvVar6;
  pointer pCVar7;
  time_t sec;
  timestamp_t tVar8;
  Vector *vector;
  FileHandle *this;
  int64_t val_00;
  long lVar9;
  IOException *this_00;
  InternalException *this_01;
  ulong uVar10;
  data_ptr_t pdVar11;
  idx_t len;
  ulong __n;
  Vector *pVVar12;
  undefined8 uVar13;
  Vector *nr_bytes;
  string_t sVar14;
  FileOpenFlags flags;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  file_handle;
  idx_t actually_read;
  string_t content_string;
  data_ptr_t read_ptr;
  vector<duckdb::OpenFileInfo,_true> *local_100;
  reference local_f8;
  value_type local_f0;
  vector<unsigned_long,_true> *local_e8;
  CachingFileSystem fs;
  ErrorData error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&input->global_state);
  CachingFileSystem::Get(&fs,context);
  local_100 = (vector<duckdb::OpenFileInfo,_true> *)(pFVar2 + 4);
  uVar4 = ((long)pFVar2[5]._vptr_FunctionData - (long)pFVar2[4]._vptr_FunctionData) / 0x30 -
          (long)pGVar3[1]._vptr_GlobalTableFunctionState;
  if (0x7ff < uVar4) {
    uVar4 = 0x800;
  }
  local_e8 = (vector<unsigned_long,_true> *)(pGVar3 + 5);
  local_f0 = 0xffffffffffffffff;
  uVar10 = 0;
  do {
    if (uVar10 == uVar4) {
      LOCK();
      pGVar3[1]._vptr_GlobalTableFunctionState =
           (_func_int **)((long)pGVar3[1]._vptr_GlobalTableFunctionState + uVar4);
      UNLOCK();
      output->count = uVar4;
      CachingFileSystem::~CachingFileSystem(&fs);
      return;
    }
    path = vector<duckdb::OpenFileInfo,_true>::get<true>
                     (local_100,(long)pGVar3[1]._vptr_GlobalTableFunctionState + uVar10);
    file_handle.
    super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
    .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>)
         (__uniq_ptr_data<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true,_true>
          )0x0;
    if (*(char *)&pGVar3[8]._vptr_GlobalTableFunctionState != '\0') {
      bVar1 = FileSystem::IsRemoteFile((string *)path);
      flags._8_8_ = (ulong)bVar1 * 4 + 1;
      flags.flags = (idx_t)path;
      CachingFileSystem::OpenFile((CachingFileSystem *)&error,(OpenFileInfo *)&fs,flags);
      uVar13 = error._0_8_;
      error.initialized = false;
      error.type = INVALID;
      error._2_6_ = 0;
      ::std::
      __uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
      reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
             *)&file_handle,(pointer)uVar13);
      ::std::unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
      ::~unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
                     *)&error);
    }
    for (__n = 0; __n < (ulong)((long)pGVar3[6]._vptr_GlobalTableFunctionState -
                                (long)pGVar3[5]._vptr_GlobalTableFunctionState >> 3); __n = __n + 1)
    {
      pvVar5 = vector<unsigned_long,_true>::get<true>(local_e8,__n);
      if (*pvVar5 == local_f0) goto LAB_015a6fbc;
      switch(*pvVar5) {
      case 0:
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
        sVar14 = StringVector::AddString(pvVar6,&path->path);
        pdVar11 = pvVar6->data;
        *(long *)(pdVar11 + uVar10 * 0x10) = sVar14.value._0_8_;
        *(long *)(pdVar11 + uVar10 * 0x10 + 8) = sVar14.value._8_8_;
        break;
      case 1:
        pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                 ::operator->(&file_handle);
        vector = (Vector *)CachingFileHandle::GetFileSize(pCVar7);
        AssertMaxFileSize(&path->path,(idx_t)vector);
        local_f8 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
        content_string = StringVector::EmptyString((StringVector *)local_f8,vector,len);
        for (pVVar12 = vector; 0 < (long)pVVar12; pVVar12 = (Vector *)((long)pVVar12 - lVar9)) {
          nr_bytes = (Vector *)0x6400000;
          if (pVVar12 < (Vector *)0x6400000) {
            nr_bytes = pVVar12;
          }
          uVar13 = content_string.value.pointer.prefix;
          if (0xc < content_string.value.pointer.length) {
            uVar13 = content_string.value.pointer.ptr;
          }
          pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                   ::operator->(&file_handle);
          bVar1 = CachingFileHandle::IsRemoteFile(pCVar7);
          if (bVar1) {
            actually_read = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)nr_bytes);
            pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                     ::operator->(&file_handle);
            CachingFileHandle::Read((BufferHandle *)&error,pCVar7,&read_ptr,&actually_read);
            switchD_016b0717::default
                      ((char *)(uVar13 + ((long)vector - (long)pVVar12)),read_ptr,actually_read);
            BufferHandle::~BufferHandle((BufferHandle *)&error);
          }
          else {
            pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                     ::operator->(&file_handle);
            this = CachingFileHandle::GetFileHandle(pCVar7);
            val_00 = FileHandle::Read(this,(char *)(uVar13 + ((long)vector - (long)pVVar12)),
                                      (idx_t)nr_bytes);
            actually_read = NumericCastImpl<unsigned_long,_long,_false>::Convert(val_00);
          }
          if (actually_read == 0) {
            this_00 = (IOException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&error,"Failed to read file \'%s\' at offset %lu, unexpected EOF",
                       (allocator *)&read_ptr);
            ::std::__cxx11::string::string((string *)&local_50,(string *)path);
            IOException::IOException<std::__cxx11::string,long>
                      (this_00,(string *)&error,&local_50,(long)vector - (long)pVVar12);
            __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          lVar9 = NumericCastImpl<long,_unsigned_long,_false>::Convert(actually_read);
        }
        string_t::Finalize(&content_string);
        ReadTextOperation::VERIFY(&path->path,&content_string);
        pdVar11 = local_f8->data;
        *(undefined8 *)(pdVar11 + uVar10 * 0x10) = content_string.value._0_8_;
        *(char **)(pdVar11 + uVar10 * 0x10 + 8) = content_string.value.pointer.ptr;
        break;
      case 2:
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
        pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                 ::operator->(&file_handle);
        val = CachingFileHandle::GetFileSize(pCVar7);
        tVar8.value = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
        pdVar11 = pvVar6->data;
        goto LAB_015a6e43;
      case 3:
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
        pCVar7 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                 ::operator->(&file_handle);
        sec = CachingFileHandle::GetLastModifiedTime(pCVar7);
        tVar8 = Timestamp::FromEpochSeconds(sec);
        pdVar11 = pvVar6->data;
LAB_015a6e43:
        *(int64_t *)(pdVar11 + uVar10 * 8) = tVar8.value;
        break;
      default:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error,"Unsupported column index for read_file",
                   (allocator *)&content_string);
        InternalException::InternalException(this_01,(string *)&error);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_015a6fbc:
    }
    ::std::unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
    ~unique_ptr(&file_handle.
                 super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
               );
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static void ReadFileExecute(ClientContext &context, TableFunctionInput &input, DataChunk &output) {
	auto &bind_data = input.bind_data->Cast<ReadFileBindData>();
	auto &state = input.global_state->Cast<ReadFileGlobalState>();
	auto fs = CachingFileSystem::Get(context);

	auto output_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, bind_data.files.size() - state.current_file_idx);

	// We utilize projection pushdown here to only read the file content if the 'data' column is requested
	for (idx_t out_idx = 0; out_idx < output_count; out_idx++) {
		// Add the file name to the output
		auto &file = bind_data.files[state.current_file_idx + out_idx];

		unique_ptr<CachingFileHandle> file_handle = nullptr;

		// Given the columns requested, do we even need to open the file?
		if (state.requires_file_open) {
			auto flags = FileFlags::FILE_FLAGS_READ;
			if (FileSystem::IsRemoteFile(file.path)) {
				flags |= FileFlags::FILE_FLAGS_DIRECT_IO;
			}
			file_handle = fs.OpenFile(file, flags);
		}

		for (idx_t col_idx = 0; col_idx < state.column_ids.size(); col_idx++) {
			// We utilize projection pushdown to avoid potentially expensive fs operations.
			auto proj_idx = state.column_ids[col_idx];
			if (proj_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
			try {
				switch (proj_idx) {
				case ReadFileBindData::FILE_NAME_COLUMN: {
					auto &file_name_vector = output.data[col_idx];
					auto file_name_string = StringVector::AddString(file_name_vector, file.path);
					FlatVector::GetData<string_t>(file_name_vector)[out_idx] = file_name_string;
				} break;
				case ReadFileBindData::FILE_CONTENT_COLUMN: {
					auto file_size_raw = file_handle->GetFileSize();
					AssertMaxFileSize(file.path, file_size_raw);
					auto file_size = UnsafeNumericCast<int64_t>(file_size_raw);
					auto &file_content_vector = output.data[col_idx];
					auto content_string = StringVector::EmptyString(file_content_vector, file_size_raw);

					auto remaining_bytes = UnsafeNumericCast<int64_t>(file_size);

					// Read in batches of 100mb
					constexpr auto MAX_READ_SIZE = 100LL * 1024 * 1024;
					while (remaining_bytes > 0) {
						const auto bytes_to_read = MinValue<int64_t>(remaining_bytes, MAX_READ_SIZE);
						const auto content_string_ptr =
						    content_string.GetDataWriteable() + (file_size - remaining_bytes);

						idx_t actually_read;
						if (file_handle->IsRemoteFile()) {
							// Remote file: caching read
							data_ptr_t read_ptr;
							actually_read = NumericCast<idx_t>(bytes_to_read);
							auto buffer_handle = file_handle->Read(read_ptr, actually_read);
							memcpy(content_string_ptr, read_ptr, actually_read);
						} else {
							// Local file: non-caching read
							actually_read = NumericCast<idx_t>(file_handle->GetFileHandle().Read(
							    content_string_ptr, UnsafeNumericCast<idx_t>(bytes_to_read)));
						}

						if (actually_read == 0) {
							// Uh oh, random EOF?
							throw IOException("Failed to read file '%s' at offset %lu, unexpected EOF", file.path,
							                  file_size - remaining_bytes);
						}
						remaining_bytes -= NumericCast<int64_t>(actually_read);
					}

					content_string.Finalize();

					OP::VERIFY(file.path, content_string);

					FlatVector::GetData<string_t>(file_content_vector)[out_idx] = content_string;
				} break;
				case ReadFileBindData::FILE_SIZE_COLUMN: {
					auto &file_size_vector = output.data[col_idx];
					FlatVector::GetData<int64_t>(file_size_vector)[out_idx] =
					    NumericCast<int64_t>(file_handle->GetFileSize());
				} break;
				case ReadFileBindData::FILE_LAST_MODIFIED_COLUMN: {
					auto &last_modified_vector = output.data[col_idx];
					// This can sometimes fail (e.g. httpfs file system cant always parse the last modified time
					// correctly)
					try {
						auto timestamp_seconds = Timestamp::FromEpochSeconds(file_handle->GetLastModifiedTime());
						FlatVector::GetData<timestamp_tz_t>(last_modified_vector)[out_idx] =
						    timestamp_tz_t(timestamp_seconds);
					} catch (std::exception &ex) {
						ErrorData error(ex);
						if (error.Type() == ExceptionType::CONVERSION) {
							FlatVector::SetNull(last_modified_vector, out_idx, true);
						} else {
							throw;
						}
					}
				} break;
				default:
					throw InternalException("Unsupported column index for read_file");
				}
			}
			// Filesystems are not required to support all operations, so we just set the column to NULL if not
			// implemented
			catch (std::exception &ex) {
				ErrorData error(ex);
				if (error.Type() == ExceptionType::NOT_IMPLEMENTED) {
					FlatVector::SetNull(output.data[col_idx], out_idx, true);
				} else {
					throw;
				}
			}
		}
	}

	state.current_file_idx += output_count;
	output.SetCardinality(output_count);
}